

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello_world.cpp
# Opt level: O1

void __thiscall hello::hello_world(hello *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  cookie *pcVar5;
  ostream *poVar6;
  long *plVar7;
  info *piVar8;
  long lVar9;
  _Rb_tree_node_base *p_Var10;
  code *pcVar11;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  string t1;
  string t3;
  string t2;
  ostringstream ss;
  message_type local_490;
  streamable local_410;
  hello *local_3f0;
  formattible_type local_3e8;
  undefined1 *local_3d8 [2];
  undefined1 local_3c8 [16];
  basic_format<char> local_3b8;
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  string_type local_230;
  string_type local_210;
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  time_t local_1d0;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  time((time_t *)0x0);
  std::ostream::_M_insert<long>((long)local_1a8);
  pcVar5 = (cookie *)cppcms::application::response();
  local_1f0[0] = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"test","");
  std::__cxx11::stringbuf::str();
  cppcms::http::cookie::cookie((cookie *)&local_3b8,local_1f0,local_1c8);
  cppcms::http::response::set_cookie(pcVar5);
  cppcms::http::cookie::~cookie((cookie *)&local_3b8);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0]);
  }
  if (local_1f0[0] != local_1e0) {
    operator_delete(local_1f0[0]);
  }
  cppcms::application::response();
  poVar6 = (ostream *)cppcms::http::response::out();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"<html><body>\n<h1>Hello World!</h1>\n",0x23);
  local_3d8[0] = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"text","");
  local_250[0] = local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"text text","");
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"<text>","");
  cppcms::application::response();
  poVar6 = (ostream *)cppcms::http::response::out();
  local_410.ptr_ = (void *)time((time_t *)0x0);
  cppcms::filters::streamable::set
            (&local_490,(_func_void_ostream_ptr_void_ptr *)&local_410,
             cppcms::filters::streamable::to_stream<long>,
             (type_info *)cppcms::filters::streamable::to_string<long>);
  cppcms::filters::date::date((date *)&local_3b8,(streamable *)&local_490);
  cppcms::filters::date::operator()((date *)&local_3b8,poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<br>\n",5);
  cppcms::filters::date::~date((date *)&local_3b8);
  cppcms::filters::streamable::~streamable((streamable *)&local_490);
  cppcms::application::response();
  poVar6 = (ostream *)cppcms::http::response::out();
  local_410.ptr_ = (void *)time((time_t *)0x0);
  cppcms::filters::streamable::set
            (&local_490,(_func_void_ostream_ptr_void_ptr *)&local_410,
             cppcms::filters::streamable::to_stream<long>,
             (type_info *)cppcms::filters::streamable::to_string<long>);
  cppcms::filters::time::time((time *)&local_3b8,(streamable *)&local_490);
  cppcms::filters::time::operator()((time *)&local_3b8,poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<br>\n",5);
  cppcms::filters::time::~time((time *)&local_3b8);
  cppcms::filters::streamable::~streamable((streamable *)&local_490);
  cppcms::application::response();
  poVar6 = (ostream *)cppcms::http::response::out();
  local_410.ptr_ = (void *)time((time_t *)0x0);
  pcVar11 = cppcms::filters::streamable::to_string<long>;
  cppcms::filters::streamable::set
            (&local_490,(_func_void_ostream_ptr_void_ptr *)&local_410,
             cppcms::filters::streamable::to_stream<long>,
             (type_info *)cppcms::filters::streamable::to_string<long>);
  cppcms::filters::datetime::datetime((datetime *)&local_3b8,(streamable *)&local_490);
  cppcms::filters::datetime::operator()((datetime *)&local_3b8,poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<br>\n",5);
  cppcms::filters::datetime::~datetime((datetime *)&local_3b8);
  cppcms::filters::streamable::~streamable((streamable *)&local_490);
  cppcms::application::response();
  poVar6 = (ostream *)cppcms::http::response::out();
  cppcms::filters::streamable::streamable<std::__cxx11::string>
            ((streamable *)&local_490,(string *)local_3d8);
  cppcms::filters::to_upper::to_upper((to_upper *)&local_3b8,(streamable *)&local_490);
  cppcms::filters::to_upper::operator()((to_upper *)&local_3b8,poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<br>\n",5);
  cppcms::filters::to_upper::~to_upper((to_upper *)&local_3b8);
  cppcms::filters::streamable::~streamable((streamable *)&local_490);
  cppcms::application::response();
  poVar6 = (ostream *)cppcms::http::response::out();
  cppcms::filters::streamable::streamable<std::__cxx11::string>
            ((streamable *)&local_490,(string *)local_3d8);
  cppcms::filters::to_lower::to_lower((to_lower *)&local_3b8,(streamable *)&local_490);
  cppcms::filters::to_lower::operator()((to_lower *)&local_3b8,poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<br>\n",5);
  cppcms::filters::to_lower::~to_lower((to_lower *)&local_3b8);
  cppcms::filters::streamable::~streamable((streamable *)&local_490);
  cppcms::application::response();
  poVar6 = (ostream *)cppcms::http::response::out();
  cppcms::filters::streamable::streamable<std::__cxx11::string>
            ((streamable *)&local_490,(string *)local_3d8);
  cppcms::filters::to_title::to_title((to_title *)&local_3b8,(streamable *)&local_490);
  cppcms::filters::to_title::operator()((to_title *)&local_3b8,poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<br>\n",5);
  cppcms::filters::to_title::~to_title((to_title *)&local_3b8);
  cppcms::filters::streamable::~streamable((streamable *)&local_490);
  cppcms::application::response();
  poVar6 = (ostream *)cppcms::http::response::out();
  cppcms::filters::streamable::streamable<std::__cxx11::string>
            ((streamable *)&local_490,(string *)local_270);
  cppcms::filters::escape::escape((escape *)&local_3b8,(streamable *)&local_490);
  cppcms::filters::escape::operator()((escape *)&local_3b8,poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<br>\n",5);
  cppcms::filters::escape::~escape((escape *)&local_3b8);
  cppcms::filters::streamable::~streamable((streamable *)&local_490);
  cppcms::application::response();
  poVar6 = (ostream *)cppcms::http::response::out();
  cppcms::filters::streamable::streamable<std::__cxx11::string>
            ((streamable *)&local_490,(string *)local_250);
  cppcms::filters::urlencode::urlencode((urlencode *)&local_3b8,(streamable *)&local_490);
  cppcms::filters::urlencode::operator()((urlencode *)&local_3b8,poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<br>\n",5);
  cppcms::filters::urlencode::~urlencode((urlencode *)&local_3b8);
  cppcms::filters::streamable::~streamable((streamable *)&local_490);
  cppcms::application::response();
  poVar6 = (ostream *)cppcms::http::response::out();
  cppcms::filters::streamable::streamable<std::__cxx11::string>
            ((streamable *)&local_490,(string *)local_3d8);
  cppcms::filters::base64_urlencode::base64_urlencode
            ((base64_urlencode *)&local_3b8,(streamable *)&local_490);
  cppcms::filters::base64_urlencode::operator()((base64_urlencode *)&local_3b8,poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<br>\n",5);
  cppcms::filters::base64_urlencode::~base64_urlencode((base64_urlencode *)&local_3b8);
  cppcms::filters::streamable::~streamable((streamable *)&local_490);
  cppcms::application::response();
  poVar6 = (ostream *)cppcms::http::response::out();
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"{1,datetime=f}","");
  booster::locale::basic_format<char>::basic_format(&local_3b8,&local_210);
  local_410.ptr_ = (void *)time((time_t *)0x0);
  local_490.c_id_ = (char_type *)booster::locale::details::formattible<char>::write<long>;
  local_490._0_8_ = &local_410;
  booster::locale::basic_format<char>::add(&local_3b8,(formattible_type *)&local_490);
  booster::locale::basic_format<char>::write(&local_3b8,(int)poVar6,__buf,(size_t)pcVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<br>\n",5);
  if (local_3b8.ext_params_.
      super__Vector_base<booster::locale::details::formattible<char>,_std::allocator<booster::locale::details::formattible<char>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3b8.ext_params_.
                    super__Vector_base<booster::locale::details::formattible<char>,_std::allocator<booster::locale::details::formattible<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8.format_._M_dataplus._M_p != &local_3b8.format_.field_2) {
    operator_delete(local_3b8.format_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8.message_.plural_._M_dataplus._M_p != &local_3b8.message_.plural_.field_2) {
    operator_delete(local_3b8.message_.plural_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8.message_.context_._M_dataplus._M_p != &local_3b8.message_.context_.field_2) {
    operator_delete(local_3b8.message_.context_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8.message_.id_._M_dataplus._M_p != &local_3b8.message_.id_.field_2) {
    operator_delete(local_3b8.message_.id_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  cppcms::application::response();
  poVar6 = (ostream *)cppcms::http::response::out();
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"{1,datetime=f}","");
  booster::locale::basic_format<char>::basic_format(&local_3b8,&local_230);
  local_1d0 = time((time_t *)0x0);
  pcVar11 = cppcms::filters::streamable::to_string<long>;
  cppcms::filters::streamable::set
            (&local_410,(_func_void_ostream_ptr_void_ptr *)&local_1d0,
             cppcms::filters::streamable::to_stream<long>,
             (type_info *)cppcms::filters::streamable::to_string<long>);
  cppcms::filters::escape::escape((escape *)&local_490,&local_410);
  local_3e8.writer_ = booster::locale::details::formattible<char>::write<cppcms::filters::escape>;
  local_3e8.pointer_ = (escape *)&local_490;
  booster::locale::basic_format<char>::add(&local_3b8,&local_3e8);
  booster::locale::basic_format<char>::write(&local_3b8,(int)poVar6,__buf_00,(size_t)pcVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<br>\n",5);
  cppcms::filters::escape::~escape((escape *)&local_490);
  cppcms::filters::streamable::~streamable(&local_410);
  if (local_3b8.ext_params_.
      super__Vector_base<booster::locale::details::formattible<char>,_std::allocator<booster::locale::details::formattible<char>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3b8.ext_params_.
                    super__Vector_base<booster::locale::details::formattible<char>,_std::allocator<booster::locale::details::formattible<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8.format_._M_dataplus._M_p != &local_3b8.format_.field_2) {
    operator_delete(local_3b8.format_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8.message_.plural_._M_dataplus._M_p != &local_3b8.message_.plural_.field_2) {
    operator_delete(local_3b8.message_.plural_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8.message_.context_._M_dataplus._M_p != &local_3b8.message_.context_.field_2) {
    operator_delete(local_3b8.message_.context_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8.message_.id_._M_dataplus._M_p != &local_3b8.message_.id_.field_2) {
    operator_delete(local_3b8.message_.id_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  cppcms::application::response();
  poVar6 = (ostream *)cppcms::http::response::out();
  cppcms::application::response();
  plVar7 = (long *)cppcms::http::response::out();
  std::locale::locale((locale *)&local_490,
                      (locale *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0xd0));
  piVar8 = std::use_facet<booster::locale::info>((locale *)&local_490);
  (**(code **)(*(long *)piVar8 + 0x10))(&local_3b8,piVar8,0);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(char *)CONCAT44(local_3b8.message_._4_4_,local_3b8.message_.n_),
                      (long)local_3b8.message_.c_id_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<br>\n",5);
  if ((char_type **)CONCAT44(local_3b8.message_._4_4_,local_3b8.message_.n_) !=
      &local_3b8.message_.c_context_) {
    operator_delete((undefined1 *)CONCAT44(local_3b8.message_._4_4_,local_3b8.message_.n_));
  }
  std::locale::~locale((locale *)&local_490);
  cppcms::application::request();
  lVar9 = cppcms::http::request::cookies_abi_cxx11_();
  p_Var10 = *(_Rb_tree_node_base **)(lVar9 + 0x18);
  while( true ) {
    cppcms::application::request();
    lVar9 = cppcms::http::request::cookies_abi_cxx11_();
    if (p_Var10 == (_Rb_tree_node_base *)(lVar9 + 8)) break;
    cppcms::application::response();
    poVar6 = (ostream *)cppcms::http::response::out();
    poVar6 = (ostream *)cppcms::http::operator<<(poVar6,(cookie *)(p_Var10 + 2));
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<br/>\n",6);
    p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
  }
  cppcms::application::response();
  poVar6 = (ostream *)cppcms::http::response::out();
  local_410.ptr_ = (void *)time((time_t *)0x0);
  cppcms::filters::streamable::set
            (&local_490,(_func_void_ostream_ptr_void_ptr *)&local_410,
             cppcms::filters::streamable::to_stream<long>,
             (type_info *)cppcms::filters::streamable::to_string<long>);
  cppcms::filters::date::date((date *)&local_3b8,(streamable *)&local_490);
  cppcms::filters::date::operator()((date *)&local_3b8,poVar6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  cppcms::filters::date::~date((date *)&local_3b8);
  cppcms::filters::streamable::~streamable((streamable *)&local_490);
  cppcms::application::response();
  poVar6 = (ostream *)cppcms::http::response::out();
  local_3b8.message_.n_ = 0;
  local_3b8.message_.c_id_ = "hello\n";
  local_3b8.message_.c_context_ = (char_type *)0x0;
  local_3b8.message_.c_plural_ = (char_type *)0x0;
  local_3b8.message_.id_._M_dataplus._M_p = (pointer)&local_3b8.message_.id_.field_2;
  local_3b8.message_.id_._M_string_length = 0;
  local_3b8.message_.id_.field_2._M_local_buf[0] = '\0';
  local_3b8.message_.context_._M_dataplus._M_p = (pointer)&local_3b8.message_.context_.field_2;
  local_3b8.message_.context_._M_string_length = 0;
  local_3b8.message_.context_.field_2._M_local_buf[0] = '\0';
  local_3b8.message_.plural_._M_dataplus._M_p = (pointer)&local_3b8.message_.plural_.field_2;
  local_3b8.message_.plural_._M_string_length = 0;
  local_3b8.message_.plural_.field_2._M_local_buf[0] = '\0';
  pcVar11 = cppcms::filters::streamable::to_string<booster::locale::basic_message<char>>;
  cppcms::filters::streamable::set
            (&local_410,(_func_void_ostream_ptr_void_ptr *)&local_3b8,
             cppcms::filters::streamable::to_stream<booster::locale::basic_message<char>>,
             (type_info *)
             cppcms::filters::streamable::to_string<booster::locale::basic_message<char>>);
  cppcms::filters::escape::escape((escape *)&local_490,&local_410);
  cppcms::filters::escape::operator()((escape *)&local_490,poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<br>",4);
  cppcms::filters::escape::~escape((escape *)&local_490);
  cppcms::filters::streamable::~streamable(&local_410);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8.message_.plural_._M_dataplus._M_p != &local_3b8.message_.plural_.field_2) {
    operator_delete(local_3b8.message_.plural_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8.message_.context_._M_dataplus._M_p != &local_3b8.message_.context_.field_2) {
    operator_delete(local_3b8.message_.context_._M_dataplus._M_p);
  }
  local_3f0 = this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8.message_.id_._M_dataplus._M_p != &local_3b8.message_.id_.field_2) {
    operator_delete(local_3b8.message_.id_._M_dataplus._M_p);
  }
  local_3e8.pointer_ = (void *)((ulong)local_3e8.pointer_ & 0xffffffff00000000);
  paVar1 = &local_490.id_.field_2;
  paVar2 = &local_490.context_.field_2;
  paVar3 = &local_490.plural_.field_2;
  do {
    cppcms::application::response();
    poVar6 = (ostream *)cppcms::http::response::out();
    local_490.n_ = (int)local_3e8.pointer_;
    local_490.c_id_ = "passed one day";
    local_490.c_context_ = (char_type *)0x0;
    local_490.c_plural_ = "passed {1} days";
    local_490.id_._M_string_length = 0;
    local_490.id_.field_2._M_local_buf[0] = '\0';
    local_490.context_._M_string_length = 0;
    local_490.context_.field_2._M_local_buf[0] = '\0';
    local_490.plural_._M_string_length = 0;
    local_490.plural_.field_2._M_local_buf[0] = '\0';
    local_490.id_._M_dataplus._M_p = (pointer)paVar1;
    local_490.context_._M_dataplus._M_p = (pointer)paVar2;
    local_490.plural_._M_dataplus._M_p = (pointer)paVar3;
    booster::locale::basic_format<char>::basic_format(&local_3b8,&local_490);
    local_410.ptr_ = &local_3e8;
    local_410.to_stream_ = booster::locale::details::formattible<char>::write<int>;
    booster::locale::basic_format<char>::add(&local_3b8,(formattible_type *)&local_410);
    booster::locale::basic_format<char>::write(&local_3b8,(int)poVar6,__buf_01,(size_t)pcVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<br>\n",5);
    if (local_3b8.ext_params_.
        super__Vector_base<booster::locale::details::formattible<char>,_std::allocator<booster::locale::details::formattible<char>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3b8.ext_params_.
                      super__Vector_base<booster::locale::details::formattible<char>,_std::allocator<booster::locale::details::formattible<char>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8.format_._M_dataplus._M_p != &local_3b8.format_.field_2) {
      operator_delete(local_3b8.format_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8.message_.plural_._M_dataplus._M_p != &local_3b8.message_.plural_.field_2) {
      operator_delete(local_3b8.message_.plural_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8.message_.context_._M_dataplus._M_p != &local_3b8.message_.context_.field_2) {
      operator_delete(local_3b8.message_.context_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8.message_.id_._M_dataplus._M_p != &local_3b8.message_.id_.field_2) {
      operator_delete(local_3b8.message_.id_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490.plural_._M_dataplus._M_p != paVar3) {
      operator_delete(local_490.plural_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490.context_._M_dataplus._M_p != paVar2) {
      operator_delete(local_490.context_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490.id_._M_dataplus._M_p != paVar1) {
      operator_delete(local_490.id_._M_dataplus._M_p);
    }
    iVar4 = (int)local_3e8.pointer_;
    pcVar11 = (code *)(ulong)((int)local_3e8.pointer_ + 1U);
    local_3e8.pointer_ = (void *)CONCAT44(local_3e8.pointer_._4_4_,(int)local_3e8.pointer_ + 1U);
  } while (iVar4 < 0x1d);
  cppcms::application::response();
  poVar6 = (ostream *)cppcms::http::response::out();
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"<body></html>\n",0xe);
  if (local_270[0] != local_260) {
    operator_delete(local_270[0]);
  }
  if (local_250[0] != local_240) {
    operator_delete(local_250[0]);
  }
  if (local_3d8[0] != local_3c8) {
    operator_delete(local_3d8[0]);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void hello_world()
	{
		using namespace cppcms;
		std::ostringstream ss;
		ss<<std::time(NULL);
		response().set_cookie(cppcms::http::cookie("test",ss.str()));
		response().out() <<
			"<html><body>\n"
			"<h1>Hello World!</h1>\n";
		std::string t1="text";
		std::string t2="text text";
		std::string t3="<text>";
		response().out()<<cppcms::filters::date(time(0)) << "<br>\n";
		response().out()<<cppcms::filters::time(time(0)) << "<br>\n";
		response().out()<<cppcms::filters::datetime(time(0)) << "<br>\n";
		response().out()<<cppcms::filters::to_upper(t1) << "<br>\n";
		response().out()<<cppcms::filters::to_lower(t1) << "<br>\n";
		response().out()<<cppcms::filters::to_title(t1) << "<br>\n";
		response().out()<<cppcms::filters::escape(t3) << "<br>\n";
		response().out()<<cppcms::filters::urlencode(t2) << "<br>\n";
		response().out()<<cppcms::filters::base64_urlencode(t1) << "<br>\n";
		response().out()<<locale::format("{1,datetime=f}") % time(0) << "<br>\n";
		response().out()<<locale::format("{1,datetime=f}") % cppcms::filters::escape(time(0)) << "<br>\n";
		response().out()<<std::use_facet<locale::info>(response().out().getloc()).language()<<"<br>\n";
		cppcms::http::request::cookies_type::const_iterator p;
		for(p=request().cookies().begin();p!=request().cookies().end();++p) {
			response().out()<<p->second<<"<br/>\n";
		}

		response().out() << filters::date(time(0)) <<std::endl;

		response().out() << filters::escape(locale::translate("hello\n")) << "<br>";
		
		for(int i=0;i<30;i++) {
			response().out() << locale::format(locale::translate("passed one day","passed {1} days",i)) % i << "<br>\n";
		}
		response().out()
			<<"<body></html>\n";

	}